

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall CppJieba::Trie::_trieInsert(Trie *this,char *filePath)

{
  bool bVar1;
  istream *piVar2;
  size_type sVar3;
  char *pcVar4;
  undefined8 uVar5;
  reference pvVar6;
  char *in_RSI;
  TrieNodeInfo nodeInfo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vecBuf;
  string line;
  ifstream ifile;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  TrieNodeInfo *in_stack_fffffffffffffc90;
  char *local_350;
  allocator local_321;
  string local_320 [32];
  undefined4 local_300;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [8];
  string *in_stack_fffffffffffffd38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  TrieNodeInfo *in_stack_fffffffffffffd60;
  Trie *in_stack_fffffffffffffd68;
  string local_280 [24];
  string local_240 [32];
  istream local_220 [543];
  byte local_1;
  
  std::ifstream::ifstream(local_220,in_RSI,_S_in);
  std::__cxx11::string::string(local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1401d8);
  TrieNodeInfo::TrieNodeInfo((TrieNodeInfo *)in_stack_fffffffffffffc80);
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) {
      local_1 = 1;
LAB_00140633:
      local_300 = 1;
      TrieNodeInfo::~TrieNodeInfo((TrieNodeInfo *)in_stack_fffffffffffffc80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffc90);
      std::__cxx11::string::~string(local_240);
      std::ifstream::~ifstream(local_220);
      return (bool)(local_1 & 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x140239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0," ",&local_2d1);
    Limonp::splitStr(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffda8);
    if (3 < sVar3) {
      pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar4 == (char *)0x0) {
        local_350 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
      }
      else {
        local_350 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                            ,0x2f);
        local_350 = local_350 + 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"line[%s] illegal.",&local_2f9);
      uVar5 = std::__cxx11::string::c_str();
      Limonp::Logger::LoggingF(3,local_350,0x148,(string *)local_2f8,uVar5);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      local_1 = 0;
      goto LAB_00140633;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffda8,0);
    bVar1 = TransCode::decode((string *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00140633;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffda8,1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    atoi(pcVar4);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffda8);
    if (sVar3 == 3) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&stack0xfffffffffffffda8,2);
      std::__cxx11::string::operator=(local_280,(string *)pvVar6);
    }
    bVar1 = _insert(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    if (!bVar1) {
      pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                       ,0x2f);
      if (pcVar4 == (char *)0x0) {
        in_stack_fffffffffffffc80 =
             "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
        ;
      }
      else {
        in_stack_fffffffffffffc80 =
             strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                     ,0x2f);
        in_stack_fffffffffffffc80 = in_stack_fffffffffffffc80 + 1;
      }
      in_stack_fffffffffffffc90 = (TrieNodeInfo *)in_stack_fffffffffffffc80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"_insert node failed!",&local_321);
      Limonp::Logger::LoggingF(3,in_stack_fffffffffffffc80,0x158,(string *)local_320);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
    }
  } while( true );
}

Assistant:

bool _trieInsert(const char * const filePath)
            {
                ifstream ifile(filePath);
                string line;
                vector<string> vecBuf;

                TrieNodeInfo nodeInfo;
                while(getline(ifile, line))
                {
                    vecBuf.clear();
                    splitStr(line, vecBuf, " ");
                    if(3 < vecBuf.size())
                    {
                        LogError("line[%s] illegal.", line.c_str());
                        return false;
                    }
                    if(!TransCode::decode(vecBuf[0], nodeInfo.word))
                    {
                        return false;
                    }
                    nodeInfo.freq = atoi(vecBuf[1].c_str());
                    if(3 == vecBuf.size())
                    {
                        nodeInfo.tag = vecBuf[2];
                    }

                    //_insert node
                    if(!_insert(nodeInfo))
                    {
                        LogError("_insert node failed!");
                    }
                }
                return true;
            }